

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

void env_arr_new(char *identifer,int line,long numElements,Environment *env)

{
  int iVar1;
  Object value;
  Record *pRVar2;
  Object *pOVar3;
  void *pvVar4;
  long local_80;
  long i;
  Object o;
  long bak;
  Record *match;
  Environment *env_local;
  long numElements_local;
  int line_local;
  char *identifer_local;
  
  pRVar2 = env_match(identifer,env);
  if ((pRVar2 == (Record *)0x0) || ((pRVar2->object).type == OBJECT_ARRAY)) {
    if (pRVar2 != (Record *)0x0) {
      iVar1 = (pRVar2->object).field_1.literal.line;
      (pRVar2->object).field_1.literal.line = (int)numElements;
      pOVar3 = (Object *)realloc((pRVar2->object).field_1.arr.values,numElements << 6);
      (pRVar2->object).field_1.arr.values = pOVar3;
      for (o.field_1.routine.code.statements = (Statement *)(long)iVar1;
          (long)o.field_1.routine.code.statements < numElements;
          o.field_1.routine.code.statements =
               (Statement *)((long)&(o.field_1.routine.code.statements)->type + 1)) {
        (pRVar2->object).field_1.arr.values[(long)o.field_1.routine.code.statements].type =
             OBJECT_NULL;
      }
      return;
    }
  }
  else {
    printf("\x1b[31m\n[Runtime Error] [Line:%d] Variable %s is already defined!\x1b[0m",
           (ulong)(uint)line,identifer);
  }
  pvVar4 = malloc(numElements << 6);
  for (local_80 = 0; local_80 < numElements; local_80 = local_80 + 1) {
    *(undefined4 *)((long)pvVar4 + local_80 * 0x40) = 0;
  }
  value._4_4_ = i._4_4_;
  value.type = 2;
  value.field_1.literal.type = o._4_4_;
  value.field_1.literal.line = (int)numElements;
  value.field_1.arr.values = (Object *)pvVar4;
  value.field_1._16_8_ = o.field_1.arr.values;
  value.field_1._24_8_ = o.field_1._16_8_;
  value.field_1._32_8_ = o.field_1.routine.arguments;
  value.field_1._40_8_ = o.field_1._32_8_;
  value.field_1.routine.code.statements = o.field_1.container.constructor.statements;
  rec_new(identifer,value,env);
  return;
}

Assistant:

void env_arr_new(char *identifer, int line, long numElements, Environment *env){
    Record *match = env_match(identifer, env);
    if(match != NULL && match->object.type != OBJECT_ARRAY)
        printf(runtime_error("Variable %s is already defined!"), line, identifer);
    else if(match != NULL){
        long bak = match->object.arr.count;
        match->object.arr.count = numElements;
        match->object.arr.values = (Object *)reallocate(match->object.arr.values, sizeof(Object)*numElements);
        while(bak < numElements){
            match->object.arr.values[bak].type = OBJECT_NULL;
            bak++;
        }
        return;
    }
    Object o;
    o.type = OBJECT_ARRAY;
    o.arr.count = numElements;
    o.arr.values = (Object *)mallocate(sizeof(Object) * numElements);
    long i = 0;
    while(i < numElements){
        o.arr.values[i].type = OBJECT_NULL;
        i++;
    }
    rec_new(identifer, o, env);
}